

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta)

{
  uint *args_1;
  bool bVar1;
  uint r_size;
  uint uVar2;
  bool bVar3;
  long lVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  double theta_local;
  double delta_local;
  double kappa_local;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar3 = false;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    k = (first._M_current)->first;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
    ::decrease_preference
              ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    r_size = solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                         *)this,it.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl,
                        (row_iterator)
                        it.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                        .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                        super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl,x);
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>
              (*(rc_data **)(this + 0x58),*(rc_data **)(this + 0x58) + (int)r_size,
               *(random_engine **)(this + 8));
    args_1 = (uint *)(*(long *)(this + 0x60) + (long)k * 4);
    uVar2 = *args_1;
    if ((int)r_size < (int)uVar2) {
      uVar2 = r_size;
    }
    selected = uVar2 - 1;
    fmt_00._M_str = "constraints {}: {} = ";
    fmt_00._M_len = 0x15;
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&k,(int *)args_1);
    for (lVar4 = 0; (ulong)(~((int)r_size >> 0x1f) & r_size) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      fmt_01._M_str = "{} ({}) ";
      fmt_01._M_len = 8;
      debug_logger<true>::log<double,int>
                ((debug_logger<true> *)this,fmt_01,(double *)(*(long *)(this + 0x58) + lVar4),
                 (int *)(*(long *)(this + 0x58) + 8 + lVar4));
    }
    fmt_02._M_str = " => Selected: {}\n";
    fmt_02._M_len = 0x11;
    debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&selected);
    bVar1 = affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,r_size,kappa_local,delta_local);
    bVar3 = (bool)(bVar3 | bVar1);
  }
  return bVar3;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }